

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

error_info * __thiscall
toml::detail::context<toml::type_config>::pop_last_error(context<toml::type_config> *this)

{
  error_info *in_RDI;
  type *e;
  error_info *in_stack_ffffffffffffffc8;
  
  std::vector<toml::error_info,_std::allocator<toml::error_info>_>::back
            ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)in_RDI);
  error_info::error_info(in_RDI,in_stack_ffffffffffffffc8);
  std::vector<toml::error_info,_std::allocator<toml::error_info>_>::pop_back
            ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)0x7370ce);
  return in_RDI;
}

Assistant:

error_info pop_last_error()
    {
        assert( ! errors_.empty());
        auto e = std::move(errors_.back());
        errors_.pop_back();
        return e;
    }